

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

_Bool upb_Map_Next(upb_Map *map,upb_MessageValue *key,upb_MessageValue *val,size_t *iter)

{
  _Bool _Var1;
  upb_value uStack_40;
  _Bool ok;
  upb_value v;
  upb_StringView k;
  size_t *iter_local;
  upb_MessageValue *val_local;
  upb_MessageValue *key_local;
  upb_Map *map_local;
  
  _Var1 = upb_strtable_next2(&map->table,(upb_StringView *)&v,&stack0xffffffffffffffc0,
                             (intptr_t *)iter);
  if (_Var1) {
    _upb_map_fromkey(_v,key,(long)map->key_size);
    _upb_map_fromvalue(uStack_40,val,(long)map->val_size);
  }
  return _Var1;
}

Assistant:

bool upb_Map_Next(const upb_Map* map, upb_MessageValue* key,
                  upb_MessageValue* val, size_t* iter) {
  upb_StringView k;
  upb_value v;
  const bool ok = upb_strtable_next2(&map->table, &k, &v, (intptr_t*)iter);
  if (ok) {
    _upb_map_fromkey(k, key, map->key_size);
    _upb_map_fromvalue(v, val, map->val_size);
  }
  return ok;
}